

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlHandle __thiscall despot::util::tinyxml::TiXmlHandle::FirstChildElement(TiXmlHandle *this)

{
  TiXmlElement *pTVar1;
  undefined8 *in_RSI;
  
  if ((TiXmlNode *)*in_RSI != (TiXmlNode *)0x0) {
    pTVar1 = TiXmlNode::FirstChildElement((TiXmlNode *)*in_RSI);
    if (pTVar1 != (TiXmlElement *)0x0) goto LAB_00178e3e;
  }
  pTVar1 = (TiXmlElement *)0x0;
LAB_00178e3e:
  this->node = &pTVar1->super_TiXmlNode;
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::FirstChildElement() const {
	if (node) {
		TiXmlElement* child = node->FirstChildElement();
		if (child)
			return TiXmlHandle(child);
	}
	return TiXmlHandle(0);
}